

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Value::operator[](Value *this,UInt index)

{
  map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
  *this_00;
  reference ppVar1;
  bool bVar2;
  bool local_b9;
  const_iterator local_98;
  _Base_ptr local_90;
  undefined1 local_88 [8];
  value_type defaultValue;
  _Self local_60 [3];
  _Self local_48;
  iterator it;
  CZString key;
  UInt index_local;
  Value *this_local;
  
  bVar2 = true;
  if ((*(ushort *)&this->field_0x8 & 0xff) != 0) {
    bVar2 = (*(ushort *)&this->field_0x8 & 0xff) == 6;
  }
  if (bVar2) {
    if ((*(ushort *)&this->field_0x8 & 0xff) == 0) {
      Value((Value *)&key.index_,arrayValue);
      operator=(this,(Value *)&key.index_);
      ~Value((Value *)&key.index_);
    }
    CZString::CZString((CZString *)&it,index);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::lower_bound((this->value_).map_,(CZString *)&it);
    local_60[0]._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end((this->value_).map_);
    bVar2 = std::operator!=(&local_48,local_60);
    local_b9 = false;
    if (bVar2) {
      ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_48);
      local_b9 = CZString::operator==(&ppVar1->first,(CZString *)&it);
    }
    if (local_b9 == false) {
      std::pair<const_Json::Value::CZString,_Json::Value>::pair<Json::Value::CZString_&,_true>
                ((pair<const_Json::Value::CZString,_Json::Value> *)local_88,(CZString *)&it,
                 (Value *)null);
      this_00 = (map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                 *)(this->value_).map_;
      std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
      _Rb_tree_const_iterator(&local_98,&local_48);
      local_90 = (_Base_ptr)
                 std::
                 map<Json::Value::CZString,Json::Value,std::less<Json::Value::CZString>,std::allocator<std::pair<Json::Value::CZString_const,Json::Value>>>
                 ::insert<std::pair<Json::Value::CZString_const,Json::Value>&>
                           (this_00,local_98,
                            (pair<const_Json::Value::CZString,_Json::Value> *)local_88);
      local_48._M_node = local_90;
      ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_48);
      defaultValue.second._12_4_ = 1;
      std::pair<const_Json::Value::CZString,_Json::Value>::~pair
                ((pair<const_Json::Value::CZString,_Json::Value> *)local_88);
    }
    else {
      ppVar1 = std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*(&local_48);
      defaultValue.second._12_4_ = 1;
    }
    this_local = &ppVar1->second;
    CZString::~CZString((CZString *)&it);
    return this_local;
  }
  __assert_fail("type_ == nullValue || type_ == arrayValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                ,0x33f,"Value &Json::Value::operator[](UInt)");
}

Assistant:

Value&
Value::operator[] ( UInt index )
{
    JSON_ASSERT ( type_ == nullValue  ||  type_ == arrayValue );

    if ( type_ == nullValue )
        *this = Value ( arrayValue );

    CZString key ( index );
    ObjectValues::iterator it = value_.map_->lower_bound ( key );

    if ( it != value_.map_->end ()  &&  (*it).first == key )
        return (*it).second;

    ObjectValues::value_type defaultValue ( key, null );
    it = value_.map_->insert ( it, defaultValue );
    return (*it).second;
}